

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

Relation dg::vr::RelationsAnalyzer::ICMPToRel(ICmpInst *icmp,bool assumption)

{
  Predicate PVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,assumption) == 0) {
    PVar1 = llvm::CmpInst::getInversePredicate((CmpInst *)icmp);
  }
  else {
    PVar1 = llvm::ICmpInst::getSignedPredicate(icmp);
  }
  if (PVar1 - FIRST_ICMP_PREDICATE < 10) {
    return *(Relation *)(&DAT_0014306c + (ulong)(PVar1 - FIRST_ICMP_PREDICATE) * 4);
  }
  abort();
}

Assistant:

RelationsAnalyzer::Relation
RelationsAnalyzer::ICMPToRel(const llvm::ICmpInst *icmp, bool assumption) {
    llvm::ICmpInst::Predicate pred = assumption ? icmp->getSignedPredicate()
                                                : icmp->getInversePredicate();

    switch (pred) {
    case llvm::ICmpInst::Predicate::ICMP_EQ:
        return Relation::EQ;
    case llvm::ICmpInst::Predicate::ICMP_NE:
        return Relation::NE;
    case llvm::ICmpInst::Predicate::ICMP_ULE:
        return Relation::ULE;
    case llvm::ICmpInst::Predicate::ICMP_SLE:
        return Relation::SLE;
    case llvm::ICmpInst::Predicate::ICMP_ULT:
        return Relation::ULT;
    case llvm::ICmpInst::Predicate::ICMP_SLT:
        return Relation::SLT;
    case llvm::ICmpInst::Predicate::ICMP_UGE:
        return Relation::UGE;
    case llvm::ICmpInst::Predicate::ICMP_SGE:
        return Relation::SGE;
    case llvm::ICmpInst::Predicate::ICMP_UGT:
        return Relation::UGT;
    case llvm::ICmpInst::Predicate::ICMP_SGT:
        return Relation::SGT;
    default:
#ifndef NDEBUG
        llvm::errs() << "Unhandled predicate in" << *icmp << "\n";
#endif
        abort();
    }
}